

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ILBDOperator.cpp
# Opt level: O1

void __thiscall lts2::LBDOperator::drawSelfAsCircles(LBDOperator *this,Mat *destImage)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  IntegratingCell *pIVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  undefined4 local_d0 [2];
  Mat *local_c8;
  undefined8 uStack_c0;
  ulong local_b8;
  float local_ac;
  int local_a8;
  int local_a4;
  int local_a0;
  int local_9c;
  int local_98;
  int local_94;
  int local_90;
  int local_8c;
  LBDOperator *local_88;
  int local_80;
  int local_7c;
  _InputArray local_78;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  if (**(int **)(destImage + 0x40) == 0 && (*(int **)(destImage + 0x40))[1] == 0) {
    local_80 = (this->_patchSize).width;
    local_7c = (this->_patchSize).height;
    cv::Mat::create(destImage,&local_80,0x10);
  }
  local_78.obj = &local_58;
  local_58 = 0x406fe00000000000;
  uStack_50 = 0x406fe00000000000;
  local_48 = 0x406fe00000000000;
  uStack_40 = 0x406fe00000000000;
  local_78.flags = -0x3efdfffa;
  local_78.sz.width = 1;
  local_78.sz.height = 4;
  cv::noArray();
  cv::Mat::setTo((_InputArray *)destImage,&local_78);
  local_58 = 0;
  uStack_50 = 0;
  local_48 = 0x406fe00000000000;
  uStack_40 = 0;
  local_78.sz.width = 0;
  local_78.sz.height = 0;
  uStack_60 = 0;
  local_78.flags = 0;
  local_78._4_4_ = 0;
  local_78.obj = (void *)0x0;
  if (*(int *)&(this->super_LinearOperator).field_0xc != 0) {
    local_b8 = 0;
    local_88 = this;
    do {
      pIVar5 = this->_sensitiveCells;
      uVar1 = this->_basisFunctions[local_b8].pos_cell;
      uVar2 = this->_basisFunctions[local_b8].neg_cell;
      iVar8 = pIVar5[uVar1].xmax;
      iVar6 = pIVar5[uVar1].ymax;
      fVar13 = (float)(this->_patchSize).width;
      iVar10 = pIVar5[uVar2].xmax;
      iVar3 = pIVar5[uVar1].ymin;
      iVar4 = pIVar5[uVar2].ymax;
      fVar14 = (float)(this->_patchSize).height;
      local_ac = (float)*(int *)(destImage + 0xc);
      fVar11 = rintf(((float)pIVar5[uVar1].xmin / fVar13) * local_ac);
      fVar13 = rintf(((float)(iVar8 + -1) / fVar13) * local_ac);
      iVar8 = *(int *)(destImage + 8);
      fVar12 = rintf(((float)iVar3 / fVar14) * (float)iVar8);
      fVar14 = rintf(((float)(iVar6 + -1) / fVar14) * (float)iVar8);
      iVar6 = (int)fVar14 - (int)fVar12;
      iVar8 = (int)fVar13 - (int)fVar11;
      if (iVar6 < iVar8) {
        iVar8 = iVar6;
      }
      iVar8 = iVar8 / 2;
      iVar7 = (int)fVar11 + iVar8;
      iVar9 = (int)fVar12 + iVar8;
      iVar6 = pIVar5[uVar2].xmin;
      iVar3 = pIVar5[uVar2].ymin;
      uStack_c0 = 0;
      local_d0[0] = 0x3010000;
      local_c8 = destImage;
      local_90 = iVar7;
      local_8c = iVar9;
      cv::circle(local_d0,&local_90,iVar8,&local_58,1,8,0);
      this = local_88;
      uStack_c0 = 0;
      local_d0[0] = 0x3010000;
      local_c8 = destImage;
      local_98 = iVar7;
      local_94 = iVar9;
      cv::circle(local_d0,&local_98,1,&local_78,0xffffffff,8,0);
      fVar11 = (float)(this->_patchSize).width;
      fVar14 = (float)(this->_patchSize).height;
      iVar8 = *(int *)(destImage + 0xc);
      fVar13 = rintf(((float)iVar6 / fVar11) * (float)iVar8);
      fVar11 = rintf(((float)(iVar10 + -1) / fVar11) * (float)iVar8);
      iVar8 = *(int *)(destImage + 8);
      fVar12 = rintf(((float)iVar3 / fVar14) * (float)iVar8);
      fVar14 = rintf(((float)(iVar4 + -1) / fVar14) * (float)iVar8);
      iVar6 = (int)fVar14 - (int)fVar12;
      iVar8 = (int)fVar11 - (int)fVar13;
      if (iVar6 < iVar8) {
        iVar8 = iVar6;
      }
      iVar8 = iVar8 / 2;
      iVar6 = (int)fVar13 + iVar8;
      iVar10 = (int)fVar12 + iVar8;
      uStack_c0 = 0;
      local_d0[0] = 0x3010000;
      local_c8 = destImage;
      local_a0 = iVar6;
      local_9c = iVar10;
      cv::circle(local_d0,&local_a0,iVar8,&local_58,1,8,0);
      uStack_c0 = 0;
      local_d0[0] = 0x3010000;
      local_c8 = destImage;
      local_a8 = iVar6;
      local_a4 = iVar10;
      cv::circle(local_d0,&local_a8,1,&local_78,0xffffffff,8,0);
      local_b8 = local_b8 + 1;
    } while (local_b8 < *(uint *)&(this->super_LinearOperator).field_0xc);
  }
  return;
}

Assistant:

void lts2::LBDOperator::drawSelfAsCircles(cv::Mat &destImage) const
{
  if (destImage.size() == cv::Size(0,0))
    destImage.create(_patchSize, CV_8UC3);
  
  // Fill with white
  destImage.setTo(cv::Scalar::all(255));

  // Shortcuts
  cv::Scalar red = cv::Scalar(0, 0, 255);
  cv::Scalar black = cv::Scalar(0, 0, 0);

  // Loop over the cells
  for (int i = 0; i < this->pairs(); ++i)
  {
    cv::Point center;
    int radius, xmin, xmax, ymin, ymax;
    float n_xmin, n_xmax, n_ymin, n_ymax;

    lbd::IntegratingCell plus = _sensitiveCells[_basisFunctions[i].pos_cell];
    lbd::IntegratingCell minus = _sensitiveCells[_basisFunctions[i].neg_cell];

    // (+) first
    n_xmin = plus.xmin / (float)_patchSize.width;
    n_xmax = (plus.xmax-1) / (float)_patchSize.width;
    n_ymin = plus.ymin / (float)_patchSize.height;
    n_ymax = (plus.ymax -1)/ (float)_patchSize.height;

    xmin = rint(n_xmin * destImage.cols);
    xmax = rint(n_xmax * destImage.cols);
    ymin = rint(n_ymin * destImage.rows);
    ymax = rint(n_ymax * destImage.rows);

    radius = MIN(ymax-ymin,xmax-xmin) / 2;
    center.x = xmin + radius;
    center.y = ymin + radius;

    cv::circle(destImage, center, radius, red);
    cv::circle(destImage, center, 1, black, -1);

    // (-) now
    n_xmin = minus.xmin / (float)_patchSize.width;
    n_xmax = (minus.xmax-1) / (float)_patchSize.width;
    n_ymin = minus.ymin / (float)_patchSize.height;
    n_ymax = (minus.ymax -1)/ (float)_patchSize.height;

    xmin = rint(n_xmin * destImage.cols);
    xmax = rint(n_xmax * destImage.cols);
    ymin = rint(n_ymin * destImage.rows);
    ymax = rint(n_ymax * destImage.rows);

    radius = MIN(ymax-ymin,xmax-xmin) / 2;
    center.x = xmin + radius;
    center.y = ymin + radius;

    cv::circle(destImage, center, radius, red);
    cv::circle(destImage, center, 1, black, -1);
  }
}